

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O1

int is_afio_large(char *h,size_t len)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  
  iVar1 = 0;
  if ((((0x73 < len) && (h[0x1e] == 'm')) && (h[0x55] == 'n')) &&
     ((h[0x62] == 's' && (h[0x73] == ':')))) {
    lVar2 = -0x18;
    do {
      if (9 < (byte)(h[lVar2 + 0x1e] - 0x30U)) {
        uVar3 = (byte)h[lVar2 + 0x1e] - 0x41;
        if (0x25 < uVar3) {
          return 0;
        }
        if ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
          return 0;
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0);
    lVar2 = -0x36;
    do {
      if (9 < (byte)(h[lVar2 + 0x55] - 0x30U)) {
        uVar3 = (byte)h[lVar2 + 0x55] - 0x41;
        if (0x25 < uVar3) {
          return 0;
        }
        if ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
          return 0;
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0);
    lVar2 = -0xc;
    do {
      if (9 < (byte)(h[lVar2 + 0x62] - 0x30U)) {
        uVar3 = (byte)h[lVar2 + 0x62] - 0x41;
        if (0x25 < uVar3) {
          return 0;
        }
        if ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
          return 0;
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0);
    lVar2 = 0;
    do {
      if (9 < (byte)(h[lVar2 + 99] - 0x30U)) {
        uVar3 = (byte)h[lVar2 + 99] - 0x41;
        if (0x25 < uVar3) {
          return 0;
        }
        if ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
          return 0;
        }
      }
      lVar2 = lVar2 + 1;
      iVar1 = 1;
    } while (lVar2 != 0x10);
  }
  return iVar1;
}

Assistant:

static int
is_afio_large(const char *h, size_t len)
{
	if (len < afiol_header_size)
		return (0);
	if (h[afiol_ino_m_offset] != 'm'
	    || h[afiol_mtime_n_offset] != 'n'
	    || h[afiol_xsize_s_offset] != 's'
	    || h[afiol_filesize_c_offset] != ':')
		return (0);
	if (!is_hex(h + afiol_dev_offset, afiol_ino_m_offset - afiol_dev_offset))
		return (0);
	if (!is_hex(h + afiol_mode_offset, afiol_mtime_n_offset - afiol_mode_offset))
		return (0);
	if (!is_hex(h + afiol_namesize_offset, afiol_xsize_s_offset - afiol_namesize_offset))
		return (0);
	if (!is_hex(h + afiol_filesize_offset, afiol_filesize_size))
		return (0);
	return (1);
}